

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerbase.cpp
# Opt level: O3

UINT8 PlayerBase::InitDeviceOptions(PLR_DEV_OPTS *devOpts)

{
  devOpts->emuCore = 0;
  devOpts->srMode = '\0';
  devOpts->resmplMode = '\0';
  (devOpts->muteOpts).chnMute[0] = 0;
  (devOpts->muteOpts).chnMute[1] = 0;
  devOpts->smplRate = 0;
  devOpts->coreOpts = 0;
  (devOpts->muteOpts).disable = '\0';
  return '\0';
}

Assistant:

UINT8 PlayerBase::InitDeviceOptions(PLR_DEV_OPTS& devOpts)
{
	devOpts.emuCore = 0x00;
	devOpts.srMode = DEVRI_SRMODE_NATIVE;
	devOpts.resmplMode = 0x00;
	devOpts.smplRate = 0;
	devOpts.coreOpts = 0x00;
	devOpts.muteOpts.disable = 0x00;
	devOpts.muteOpts.chnMute[0] = 0x00;
	devOpts.muteOpts.chnMute[1] = 0x00;
	return 0x00;
}